

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O0

int fy_token_format_text_length(fy_token *fyt)

{
  int length;
  fy_token *fyt_local;
  
  if (fyt == (fy_token *)0x0) {
    fyt_local._4_4_ = 0;
  }
  else if (fyt->type == FYTT_TAG_DIRECTIVE) {
    fyt_local._4_4_ = fy_tag_directive_token_format_text_length(fyt);
  }
  else if (fyt->type == FYTT_TAG) {
    fyt_local._4_4_ = fy_tag_token_format_text_length(fyt);
  }
  else {
    fyt_local._4_4_ = fy_atom_format_text_length(&fyt->handle);
  }
  return fyt_local._4_4_;
}

Assistant:

int fy_token_format_text_length(struct fy_token *fyt) {
    int length;

    if (!fyt)
        return 0;

    switch (fyt->type) {

        case FYTT_TAG:
            return fy_tag_token_format_text_length(fyt);

        case FYTT_TAG_DIRECTIVE:
            return fy_tag_directive_token_format_text_length(fyt);

        default:
            break;
    }

    length = fy_atom_format_text_length(&fyt->handle);

    return length;
}